

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O3

void __thiscall NaPNDelay::set_delay(NaPNDelay *this,uint nDim,uint *piMap)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  undefined4 *puVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  NaPetriNode::check_tunable(&this->super_NaPetriNode);
  this->nOutDim = nDim;
  operator_delete(this->piOutMap,4);
  uVar1 = this->nOutDim;
  if ((long)(int)uVar1 == 0) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 3;
  }
  else {
    if (piMap != (uint *)0x0) {
      uVar5 = 0xffffffffffffffff;
      if (-1 < (int)uVar1) {
        uVar5 = (long)(int)uVar1 << 2;
      }
      puVar3 = (uint *)operator_new__(uVar5);
      this->piOutMap = puVar3;
      this->nMaxLag = 0;
      this->nMinLag = 0;
      uVar5 = 0;
      uVar8 = 0;
      uVar6 = 0;
      do {
        uVar2 = piMap[uVar5];
        puVar3[uVar5] = uVar2;
        if (uVar8 < uVar2) {
          this->nMaxLag = uVar2;
          uVar8 = uVar2;
        }
        uVar7 = uVar6;
        if (uVar5 == 0) {
          uVar7 = uVar2;
        }
        uVar6 = uVar7;
        if (uVar2 < uVar7) {
          uVar6 = uVar2;
        }
        if (uVar5 == 0 || uVar2 < uVar7) {
          this->nMinLag = uVar6;
        }
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
      return;
    }
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0;
  }
  __cxa_throw(puVar4,&NaException::typeinfo,0);
}

Assistant:

void
NaPNDelay::set_delay (unsigned nDim, unsigned* piMap)
{
  check_tunable();

  nOutDim = nDim;
  delete piOutMap;

  if(0 == nOutDim)
    throw(na_bad_value);
  else if(NULL == piMap)
    throw(na_null_pointer);

  piOutMap = new unsigned[nOutDim];
  nMaxLag = 0;
  nMinLag = 0;
  unsigned	i;
  for(i = 0; i < nOutDim; ++i)
    {
      piOutMap[i] = piMap[i];
      if(piOutMap[i] > nMaxLag)
	nMaxLag = piOutMap[i];

      if(0 == i)
	nMinLag = piOutMap[i];
      if(piOutMap[i] < nMinLag)
	nMinLag = piOutMap[i];
    }
}